

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O0

WatchID __thiscall
efsw::FileWatcherGeneric::addWatch
          (FileWatcherGeneric *this,string *directory,FileWatchListener *watcher,bool recursive)

{
  bool bVar1;
  Error EVar2;
  uint uVar3;
  WatcherGeneric *this_00;
  WatcherGeneric *local_1b8;
  WatcherGeneric *pWatch;
  string local_190;
  string local_170;
  undefined1 local_150 [8];
  string link;
  string curPath;
  string local_f0;
  undefined4 local_cc;
  string local_c8;
  undefined1 local_a8 [8];
  FileInfo fi;
  undefined1 local_50 [8];
  string dir;
  bool recursive_local;
  FileWatchListener *watcher_local;
  string *directory_local;
  FileWatcherGeneric *this_local;
  
  dir.field_2._M_local_buf[0xf] = recursive;
  std::__cxx11::string::string((string *)local_50,(string *)directory);
  FileSystem::dirAddSlashAtEnd((string *)local_50);
  FileInfo::FileInfo((FileInfo *)local_a8,(string *)local_50);
  bVar1 = FileInfo::isDirectory((FileInfo *)local_a8);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_c8,(string *)local_50);
    EVar2 = Errors::Log::createLastError(FileNotFound,&local_c8);
    this_local = (FileWatcherGeneric *)(long)EVar2;
    std::__cxx11::string::~string((string *)&local_c8);
    local_cc = 1;
    goto LAB_001446c9;
  }
  bVar1 = FileInfo::isReadable((FileInfo *)local_a8);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_f0,(string *)local_50);
    EVar2 = Errors::Log::createLastError(FileNotReadable,&local_f0);
    this_local = (FileWatcherGeneric *)(long)EVar2;
    std::__cxx11::string::~string((string *)&local_f0);
    local_cc = 1;
    goto LAB_001446c9;
  }
  uVar3 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[10])(this,local_50);
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::string((string *)(curPath.field_2._M_local_buf + 8),(string *)local_50);
    EVar2 = Errors::Log::createLastError(FileRepeated,(string *)((long)&curPath.field_2 + 8));
    this_local = (FileWatcherGeneric *)(long)EVar2;
    std::__cxx11::string::~string((string *)(curPath.field_2._M_local_buf + 8));
    local_cc = 1;
    goto LAB_001446c9;
  }
  std::__cxx11::string::string((string *)(link.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_170,(string *)local_50);
  FileSystem::getLinkRealPath((string *)local_150,&local_170,(string *)((long)&link.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_170);
  bVar1 = std::operator!=("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_150);
  if (bVar1) {
    uVar3 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[10])(this,local_150);
    if ((uVar3 & 1) == 0) {
      uVar3 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[9])
                        (this,(undefined1 *)((long)&link.field_2 + 8),local_150);
      if ((uVar3 & 1) != 0) {
        std::__cxx11::string::operator=((string *)local_50,(string *)local_150);
        goto LAB_001445c1;
      }
      std::__cxx11::string::string((string *)&pWatch,(string *)local_50);
      EVar2 = Errors::Log::createLastError(FileOutOfScope,(string *)&pWatch);
      this_local = (FileWatcherGeneric *)(long)EVar2;
      std::__cxx11::string::~string((string *)&pWatch);
    }
    else {
      std::__cxx11::string::string((string *)&local_190,(string *)local_50);
      EVar2 = Errors::Log::createLastError(FileRepeated,&local_190);
      this_local = (FileWatcherGeneric *)(long)EVar2;
      std::__cxx11::string::~string((string *)&local_190);
    }
  }
  else {
LAB_001445c1:
    this->mLastWatchID = this->mLastWatchID + 1;
    this_00 = (WatcherGeneric *)operator_new(0x70);
    WatcherGeneric::WatcherGeneric
              (this_00,this->mLastWatchID,(string *)local_50,watcher,&this->super_FileWatcherImpl,
               (bool)(dir.field_2._M_local_buf[0xf] & 1));
    local_1b8 = this_00;
    Mutex::lock(&this->mWatchesLock);
    std::__cxx11::list<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::push_back
              (&this->mWatches,&local_1b8);
    Mutex::unlock(&this->mWatchesLock);
    this_local = (FileWatcherGeneric *)(local_1b8->super_Watcher).ID;
  }
  local_cc = 1;
  std::__cxx11::string::~string((string *)local_150);
  std::__cxx11::string::~string((string *)(link.field_2._M_local_buf + 8));
LAB_001446c9:
  FileInfo::~FileInfo((FileInfo *)local_a8);
  std::__cxx11::string::~string((string *)local_50);
  return (WatchID)this_local;
}

Assistant:

WatchID FileWatcherGeneric::addWatch(const std::string& directory, FileWatchListener* watcher, bool recursive)
{
	std::string dir( directory );

	FileSystem::dirAddSlashAtEnd( dir );

	FileInfo fi( dir );

	if ( !fi.isDirectory() )
	{
		return Errors::Log::createLastError( Errors::FileNotFound, dir );
	}
	else if ( !fi.isReadable() )
	{
		return Errors::Log::createLastError( Errors::FileNotReadable, dir );
	}
	else if ( pathInWatches( dir ) )
	{
		return Errors::Log::createLastError( Errors::FileRepeated, dir );
	}

	std::string curPath;
	std::string link( FileSystem::getLinkRealPath( dir, curPath ) );

	if ( "" != link )
	{
		if ( pathInWatches( link ) )
		{
			return Errors::Log::createLastError( Errors::FileRepeated, dir );
		}
		else if ( !linkAllowed( curPath, link ) )
		{
			return Errors::Log::createLastError( Errors::FileOutOfScope, dir );
		}
		else
		{
			dir = link;
		}
	}

	mLastWatchID++;

	WatcherGeneric * pWatch		= new WatcherGeneric( mLastWatchID, dir, watcher, this, recursive );

	mWatchesLock.lock();
	mWatches.push_back(pWatch);
	mWatchesLock.unlock();

	return pWatch->ID;
}